

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::SetUnderwaterAcousticEmitterSystem
          (Underwater_Acoustic_PDU *this,
          vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
          *UAES)

{
  KUINT16 *pKVar1;
  pointer pUVar2;
  byte bVar3;
  int iVar4;
  pointer pUVar5;
  
  pUVar2 = (this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pUVar5 = (this->m_vUAES).
                super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                ._M_impl.super__Vector_impl_data._M_start; pUVar5 != pUVar2; pUVar5 = pUVar5 + 1) {
    bVar3 = DATA_TYPE::UnderwaterAcousticEmitterSystem::GetEmitterSystemDataLength(pUVar5);
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + (ushort)bVar3 * -4;
  }
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  ::operator=(&this->m_vUAES,UAES);
  pUVar5 = (this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pUVar5 == (this->m_vUAES).
                super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = (int)pUVar5;
  }
  else {
    do {
      bVar3 = DATA_TYPE::UnderwaterAcousticEmitterSystem::GetEmitterSystemDataLength(pUVar5);
      pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
      *pKVar1 = *pKVar1 + (ushort)bVar3 * 4;
      pUVar5 = pUVar5 + 1;
    } while (pUVar5 != (this->m_vUAES).
                       super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    iVar4 = (int)(this->m_vUAES).
                 super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  }
  this->m_ui8NumEmitterSys = (char)((uint)((int)pUVar5 - iVar4) >> 4) * -0x33;
  return;
}

Assistant:

void Underwater_Acoustic_PDU::SetUnderwaterAcousticEmitterSystem( const vector<UnderwaterAcousticEmitterSystem> & UAES )
{
    // Reset PDU length
    vector<UnderwaterAcousticEmitterSystem>::const_iterator citr = m_vUAES.begin();
    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrEnd = m_vUAES.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= citr->GetEmitterSystemDataLength() * 4;
    }

    m_vUAES = UAES;

    citr = m_vUAES.begin();

    for( ; citr != m_vUAES.end(); ++citr )
    {
        m_ui16PDULength += citr->GetEmitterSystemDataLength() * 4;
    }

    m_ui8NumEmitterSys = m_vUAES.size();
}